

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

QVariant * QVariant::fromMetaType(QMetaType type,void *copy)

{
  undefined1 uVar1;
  QMetaTypeInterface *iface_00;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  QMetaTypeInterface *iface;
  QVariant *result;
  QMetaTypeInterface *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  QMetaType local_30;
  PrivateShared *local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)((long)&(in_RDI->d).data + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(in_RDI->d).field_0x18 = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)((long)&(in_RDI->d).data + 8) = &DAT_aaaaaaaaaaaaaaaa;
  QVariant((QVariant *)0x4352c7);
  QMetaType::registerType((QMetaType *)0x4352d1);
  iface_00 = QMetaType::iface(&local_30);
  uVar1 = anon_unknown.dwarf_7eee46::isValidMetaTypeForVariant
                    ((QMetaTypeInterface *)
                     CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff78);
  if ((bool)uVar1) {
    Private::Private((Private *)CONCAT17(uVar1,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78)
    ;
    *(undefined8 *)((long)&(in_RDI->d).data + 0x10) = local_18;
    *(undefined8 *)&(in_RDI->d).field_0x18 = uStack_10;
    (in_RDI->d).data.shared = local_28;
    *(undefined8 *)((long)&(in_RDI->d).data + 8) = uStack_20;
    (anonymous_namespace)::
    customConstruct<((anonymous_namespace)::CustomConstructMoveOptions)0,((anonymous_namespace)::CustomConstructNullabilityOption)0>
              (iface_00,(Private *)CONCAT17(uVar1,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QVariant::fromMetaType(QMetaType type, const void *copy)
{
    QVariant result;
    type.registerType();
    const auto iface = type.iface();
    if (isValidMetaTypeForVariant(iface, copy)) {
        result.d = Private(iface);
        customConstruct(iface, &result.d, copy);
    }
    return result;
}